

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

bool __thiscall
rlottie::internal::renderer::ShapeLayer::resolveKeyPath
          (ShapeLayer *this,LOTKeyPath *keyPath,uint32_t depth,LOTVariant *value)

{
  bool bVar1;
  uint32_t uVar2;
  string *key;
  char *pcVar3;
  undefined8 in_RCX;
  LOTKeyPath *in_RSI;
  long in_RDI;
  LOTVariant *in_stack_00000010;
  uint32_t in_stack_0000001c;
  LOTKeyPath *in_stack_00000020;
  Layer *in_stack_00000028;
  uint32_t newDepth;
  LOTKeyPath *pLVar4;
  undefined4 in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffff64;
  allocator local_71;
  string local_70 [32];
  uint32_t local_50;
  allocator local_49;
  string local_48 [32];
  undefined8 local_28;
  LOTKeyPath *local_18;
  bool local_1;
  
  local_28 = in_RCX;
  local_18 = in_RSI;
  bVar1 = Layer::resolveKeyPath
                    (in_stack_00000028,in_stack_00000020,in_stack_0000001c,in_stack_00000010);
  if (bVar1) {
    pLVar4 = local_18;
    key = (string *)Layer::name((Layer *)0x15f55f);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,(char *)key,&local_49);
    bVar1 = LOTKeyPath::propagate(pLVar4,key,in_stack_ffffffffffffff64);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    if (bVar1) {
      pLVar4 = local_18;
      pcVar3 = Layer::name((Layer *)0x15f5d4);
      uVar2 = (uint32_t)((ulong)pLVar4 >> 0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,pcVar3,&local_71);
      uVar2 = LOTKeyPath::nextDepth
                        ((LOTKeyPath *)key,
                         (string *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         uVar2);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      local_50 = uVar2;
      (**(code **)(**(long **)(in_RDI + 0x78) + 0x20))
                (*(long **)(in_RDI + 0x78),local_18,uVar2,local_28);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool renderer::ShapeLayer::resolveKeyPath(LOTKeyPath &keyPath, uint32_t depth,
                                          LOTVariant &value)
{
    if (renderer::Layer::resolveKeyPath(keyPath, depth, value)) {
        if (keyPath.propagate(name(), depth)) {
            uint32_t newDepth = keyPath.nextDepth(name(), depth);
            mRoot->resolveKeyPath(keyPath, newDepth, value);
        }
        return true;
    }
    return false;
}